

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::UpdateArrayValueTypes(BackwardPass *this,Instr *instr,Opnd *origOpnd)

{
  code *pcVar1;
  short sVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  ValueType VVar6;
  undefined4 *puVar7;
  IndirOpnd *pIVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  ArrayRegOpnd *pAVar11;
  Opnd *pOVar12;
  ArrayRegOpnd *pAVar13;
  StackSym *pSVar14;
  RegOpnd *pRVar15;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  bool local_b8;
  bool local_b7;
  bool local_b6;
  bool local_b5;
  ArrayRegOpnd *local_b0;
  Opnd *use;
  ArrayRegOpnd *checkedArraySrc;
  RegOpnd *checkedRegSrc;
  anon_class_8_1_e7f4faeb aStack_68;
  ValueType checkedSrcValueType;
  Opnd *checkedSrc;
  bool local_4f;
  bool local_4e;
  bool local_4d;
  bool removeLengthSym;
  bool removeHeadSegmentLengthSym;
  bool removeHeadSegmentSym;
  bool noForwardJsArrayHeadSegmentSymUses;
  bool changeNoMissingValues;
  bool changeNativeArray;
  bool changeArray;
  bool noForwardImplicitCallUses;
  bool isJsArray;
  ValueType valueType;
  RegOpnd *regOpnd;
  ArrayRegOpnd *arrayOpnd;
  Opnd *opnd;
  Sym *sym;
  Instr *opndOwnerInstr;
  Opnd *origOpnd_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  opndOwnerInstr = (Instr *)origOpnd;
  origOpnd_local = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1372,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IsPrePass(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1373,"(!IsPrePass())","!IsPrePass()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (origOpnd_local == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1374,"(instr)","instr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((opndOwnerInstr != (Instr *)0x0) &&
     (sym = (Sym *)origOpnd_local, sVar2 = (short)*(undefined4 *)&origOpnd_local[3]._vptr_Opnd,
     sVar2 != 0x22c && sVar2 != 0x22d)) {
    arrayOpnd = (ArrayRegOpnd *)opndOwnerInstr;
    OVar4 = IR::Opnd::GetKind((Opnd *)opndOwnerInstr);
    if (OVar4 == OpndKindSym) {
      pSVar9 = IR::Opnd::AsSymOpnd((Opnd *)arrayOpnd);
      opnd = (Opnd *)pSVar9->m_sym;
      bVar3 = Sym::IsPropertySym((Sym *)opnd);
      if (!bVar3) {
        return;
      }
      regOpnd = (RegOpnd *)0x0;
    }
    else {
      if (OVar4 != OpndKindReg) {
        if (OVar4 != OpndKindIndir) {
          return;
        }
        pIVar8 = IR::Opnd::AsIndirOpnd((Opnd *)arrayOpnd);
        arrayOpnd = (ArrayRegOpnd *)IR::IndirOpnd::GetBaseOpnd(pIVar8);
      }
      _noForwardJsArrayHeadSegmentSymUses = IR::Opnd::AsRegOpnd((Opnd *)arrayOpnd);
      opnd = (Opnd *)_noForwardJsArrayHeadSegmentSymUses->m_sym;
      bVar3 = IR::RegOpnd::IsArrayRegOpnd(_noForwardJsArrayHeadSegmentSymUses);
      if (bVar3) {
        local_b0 = IR::RegOpnd::AsArrayRegOpnd(_noForwardJsArrayHeadSegmentSymUses);
      }
      else {
        local_b0 = (ArrayRegOpnd *)0x0;
      }
      regOpnd = &local_b0->super_RegOpnd;
    }
    _removeHeadSegmentLengthSym =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)arrayOpnd);
    bVar3 = ValueType::IsAnyOptimizedArray((ValueType *)&removeHeadSegmentLengthSym);
    if (bVar3) {
      bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&removeHeadSegmentLengthSym);
      bVar5 = ValueType::IsOptimizedTypedArray((ValueType *)&removeHeadSegmentLengthSym);
      if ((bool)((bVar3 ^ 0xffU) & 1) != bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x13aa,"(!isJsArray == valueType.IsOptimizedTypedArray())",
                           "!isJsArray == valueType.IsOptimizedTypedArray()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      local_ba = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                           (this->currentBlock->noImplicitCallUses);
      local_b5 = false;
      if (bVar3) {
        bVar5 = IR::Opnd::IsValueTypeFixed((Opnd *)arrayOpnd);
        local_b5 = false;
        if (!bVar5) {
          local_b5 = local_ba;
        }
      }
      local_4d = local_b5;
      local_b6 = false;
      if (bVar3) {
        bVar5 = IR::Opnd::IsValueTypeFixed((Opnd *)arrayOpnd);
        local_b6 = false;
        if (!bVar5) {
          bVar5 = ValueType::HasVarElements((ValueType *)&removeHeadSegmentLengthSym);
          local_b6 = false;
          if (!bVar5) {
            local_b6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 (this->currentBlock->noImplicitCallNativeArrayUses);
          }
        }
      }
      local_4e = local_b6;
      local_b7 = false;
      if (bVar3) {
        bVar5 = IR::Opnd::IsValueTypeFixed((Opnd *)arrayOpnd);
        local_b7 = false;
        if (!bVar5) {
          bVar5 = ValueType::HasNoMissingValues((ValueType *)&removeHeadSegmentLengthSym);
          local_b7 = false;
          if (bVar5) {
            local_b7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 (this->currentBlock->noImplicitCallNoMissingValuesUses);
          }
        }
      }
      local_4f = local_b7;
      bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses);
      local_b8 = false;
      if ((bVar3) && (local_b8 = false, regOpnd != (RegOpnd *)0x0)) {
        pSVar10 = IR::ArrayRegOpnd::HeadSegmentSym((ArrayRegOpnd *)regOpnd);
        local_b8 = false;
        if (pSVar10 != (StackSym *)0x0) {
          local_b8 = bVar5;
        }
      }
      checkedSrc._7_1_ = local_b8;
      local_b9 = false;
      if (regOpnd != (RegOpnd *)0x0) {
        pSVar10 = IR::ArrayRegOpnd::HeadSegmentLengthSym((ArrayRegOpnd *)regOpnd);
        local_b9 = false;
        if (pSVar10 != (StackSym *)0x0) {
          if (bVar3) {
            local_ba = bVar5;
          }
          local_b9 = local_ba;
        }
      }
      checkedSrc._6_1_ = local_b9;
      if ((((bVar3) && (regOpnd != (RegOpnd *)0x0)) &&
          (pSVar10 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)regOpnd),
          pSVar10 != (StackSym *)0x0)) &&
         (bVar5 = ValueType::IsArray((ValueType *)&removeHeadSegmentLengthSym), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x13be,
                           "(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray())"
                           ,
                           "!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray()"
                          );
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      local_bb = false;
      if ((bVar3) && (local_bb = false, regOpnd != (RegOpnd *)0x0)) {
        pSVar10 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)regOpnd);
        local_bb = false;
        if (pSVar10 != (StackSym *)0x0) {
          local_bb = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                               (this->currentBlock->noImplicitCallArrayLengthSymUses);
        }
      }
      pAVar13 = arrayOpnd;
      checkedSrc._5_1_ = local_bb;
      if (((local_b5 != false) || (local_b7 != false)) ||
         ((local_b6 != false || ((local_b8 != false || (local_b9 != false)))))) {
        pAVar11 = (ArrayRegOpnd *)IR::Instr::GetDst((Instr *)sym);
        if (pAVar13 != pAVar11) {
          if (bVar3) {
            aStack_68.valueType = (ValueType *)&removeHeadSegmentLengthSym;
            pOVar12 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__0>
                                (this,(Instr *)origOpnd_local,(Opnd *)arrayOpnd,aStack_68,
                                 (Instr **)0x0);
            if (pOVar12 != (Opnd *)0x0) {
              local_4d = false;
              checkedRegSrc._6_2_ =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   IR::Opnd::GetValueType(pOVar12);
              if ((local_b6 != false) &&
                 (bVar3 = ValueType::HasVarElements((ValueType *)((long)&checkedRegSrc + 6)), !bVar3
                 )) {
                bVar3 = ValueType::HasIntElements((ValueType *)((long)&checkedRegSrc + 6));
                bVar5 = ValueType::HasIntElements((ValueType *)&removeHeadSegmentLengthSym);
                if (bVar3 == bVar5) {
                  local_4e = false;
                }
              }
              if ((local_b7 != false) &&
                 (bVar3 = ValueType::HasNoMissingValues((ValueType *)((long)&checkedRegSrc + 6)),
                 bVar3)) {
                local_4f = false;
              }
              if ((((local_b8 != false) || (local_b9 != false)) || (local_bb != false)) &&
                 (bVar3 = IR::Opnd::IsRegOpnd(pOVar12), bVar3)) {
                pRVar15 = IR::Opnd::AsRegOpnd(pOVar12);
                bVar3 = IR::RegOpnd::IsArrayRegOpnd(pRVar15);
                if (bVar3) {
                  pRVar15 = IR::Opnd::AsRegOpnd(pOVar12);
                  pAVar13 = IR::RegOpnd::AsArrayRegOpnd(pRVar15);
                  if (local_b8 != false) {
                    pSVar10 = IR::ArrayRegOpnd::HeadSegmentSym(pAVar13);
                    pSVar14 = IR::ArrayRegOpnd::HeadSegmentSym((ArrayRegOpnd *)regOpnd);
                    if (pSVar10 == pSVar14) {
                      checkedSrc._7_1_ = false;
                    }
                  }
                  if (local_b9 != false) {
                    pSVar10 = IR::ArrayRegOpnd::HeadSegmentLengthSym(pAVar13);
                    pSVar14 = IR::ArrayRegOpnd::HeadSegmentLengthSym((ArrayRegOpnd *)regOpnd);
                    if (pSVar10 == pSVar14) {
                      checkedSrc._6_1_ = false;
                    }
                  }
                  if (local_bb != false) {
                    pSVar10 = IR::ArrayRegOpnd::LengthSym(pAVar13);
                    pSVar14 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)regOpnd);
                    if (pSVar10 == pSVar14) {
                      checkedSrc._5_1_ = false;
                    }
                  }
                }
              }
            }
          }
          else {
            if (local_b9 == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x140e,"(removeHeadSegmentLengthSym)","removeHeadSegmentLengthSym"
                                );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            pOVar12 = origOpnd_local;
            pSVar10 = IR::ArrayRegOpnd::HeadSegmentLengthSym((ArrayRegOpnd *)regOpnd);
            pOVar12 = FindNoImplicitCallUse<BackwardPass::UpdateArrayValueTypes(IR::Instr*,IR::Opnd*)::__1>
                                (this,(Instr *)pOVar12,pSVar10,(anon_class_8_1_c0a7bff0)&regOpnd,
                                 (Instr **)0x0);
            if (pOVar12 != (Opnd *)0x0) {
              checkedSrc._6_1_ = false;
            }
          }
        }
        pAVar13 = arrayOpnd;
        if ((local_4d == false) && (local_4e == false)) {
          if (local_4f != false) {
            VVar6 = ValueType::SetHasNoMissingValues((ValueType *)&removeHeadSegmentLengthSym,false)
            ;
            IR::Opnd::SetValueType((Opnd *)pAVar13,VVar6);
          }
          if (checkedSrc._7_1_ != false) {
            if (regOpnd == (RegOpnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x143e,"(arrayOpnd)","arrayOpnd");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            IR::ArrayRegOpnd::RemoveHeadSegmentSym((ArrayRegOpnd *)regOpnd);
          }
          if (checkedSrc._6_1_ != false) {
            if (regOpnd == (RegOpnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1443,"(arrayOpnd)","arrayOpnd");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            IR::ArrayRegOpnd::RemoveHeadSegmentLengthSym((ArrayRegOpnd *)regOpnd);
          }
          if (checkedSrc._5_1_ != false) {
            if (regOpnd == (RegOpnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1448,"(arrayOpnd)","arrayOpnd");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            IR::ArrayRegOpnd::RemoveLengthSym((ArrayRegOpnd *)regOpnd);
          }
        }
        else {
          if (regOpnd != (RegOpnd *)0x0) {
            arrayOpnd = (ArrayRegOpnd *)
                        IR::ArrayRegOpnd::CopyAsRegOpnd
                                  ((ArrayRegOpnd *)regOpnd,(Func *)sym[1].m_next);
            bVar3 = IR::Opnd::IsIndirOpnd((Opnd *)opndOwnerInstr);
            if (bVar3) {
              pIVar8 = IR::Opnd::AsIndirOpnd((Opnd *)opndOwnerInstr);
              pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)arrayOpnd);
              IR::IndirOpnd::ReplaceBaseOpnd(pIVar8,pRVar15);
            }
            else {
              IR::Instr::Replace((Instr *)sym,&regOpnd->super_Opnd,(Opnd *)arrayOpnd);
            }
            regOpnd = (RegOpnd *)0x0;
          }
          pAVar13 = arrayOpnd;
          VVar6 = ValueType::ToLikely((ValueType *)&removeHeadSegmentLengthSym);
          IR::Opnd::SetValueType((Opnd *)pAVar13,VVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayValueTypes(IR::Instr *const instr, IR::Opnd *origOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsPrePass());
    Assert(instr);

    if(!origOpnd)
    {
        return;
    }

    IR::Instr *opndOwnerInstr = instr;
    switch(instr->m_opcode)
    {
        case Js::OpCode::StElemC:
        case Js::OpCode::StArrSegElemC:
            // These may not be fixed if we are unsure about the type of the array they're storing to
            // (because it relies on profile data) and we weren't able to hoist the array check.
            return;
    }

    Sym *sym;
    IR::Opnd* opnd = origOpnd;
    IR::ArrayRegOpnd *arrayOpnd;
    switch(opnd->GetKind())
    {
        case IR::OpndKindIndir:
            opnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            // fall-through

        case IR::OpndKindReg:
        {
            IR::RegOpnd *const regOpnd = opnd->AsRegOpnd();
            sym = regOpnd->m_sym;
            arrayOpnd = regOpnd->IsArrayRegOpnd() ? regOpnd->AsArrayRegOpnd() : nullptr;
            break;
        }

        case IR::OpndKindSym:
            sym = opnd->AsSymOpnd()->m_sym;
            if(!sym->IsPropertySym())
            {
                return;
            }
            arrayOpnd = nullptr;
            break;

        default:
            return;
    }

    const ValueType valueType(opnd->GetValueType());
    if(!valueType.IsAnyOptimizedArray())
    {
        return;
    }

    const bool isJsArray = valueType.IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueType.IsOptimizedTypedArray());

    const bool noForwardImplicitCallUses = currentBlock->noImplicitCallUses->IsEmpty();
    bool changeArray = isJsArray && !opnd->IsValueTypeFixed() && noForwardImplicitCallUses;
    bool changeNativeArray =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        !valueType.HasVarElements() &&
        currentBlock->noImplicitCallNativeArrayUses->IsEmpty();
    bool changeNoMissingValues =
        isJsArray &&
        !opnd->IsValueTypeFixed() &&
        valueType.HasNoMissingValues() &&
        currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty();
    const bool noForwardJsArrayHeadSegmentSymUses = currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty();
    bool removeHeadSegmentSym = isJsArray && arrayOpnd && arrayOpnd->HeadSegmentSym() && noForwardJsArrayHeadSegmentSymUses;
    bool removeHeadSegmentLengthSym =
        arrayOpnd &&
        arrayOpnd->HeadSegmentLengthSym() &&
        (isJsArray ? noForwardJsArrayHeadSegmentSymUses : noForwardImplicitCallUses);
    Assert(!isJsArray || !arrayOpnd || !arrayOpnd->LengthSym() || valueType.IsArray());
    bool removeLengthSym =
        isJsArray &&
        arrayOpnd &&
        arrayOpnd->LengthSym() &&
        currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty();
    if(!(changeArray || changeNoMissingValues || changeNativeArray || removeHeadSegmentSym || removeHeadSegmentLengthSym))
    {
        return;
    }

    // We have a definitely-array value type for the base, but either implicit calls are not currently being disabled for
    // legally using the value type as a definite array, or we are not currently bailing out upon creating a missing value
    // for legally using the value type as a definite array with no missing values.

    // For source opnds, ensure that a NoImplicitCallUses immediately precedes this instruction. Otherwise, convert the value
    // type to an appropriate version so that the lowerer doesn't incorrectly treat it as it says.
    if(opnd != opndOwnerInstr->GetDst())
    {
        if(isJsArray)
        {
            IR::Opnd *const checkedSrc =
                FindNoImplicitCallUse(
                    instr,
                    opnd,
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                        return
                            checkedSrcValueType.IsLikelyObject() &&
                            checkedSrcValueType.GetObjectType() == valueType.GetObjectType();
                    });
            if(checkedSrc)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                changeArray = false;

                const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                if(changeNativeArray &&
                    !checkedSrcValueType.HasVarElements() &&
                    checkedSrcValueType.HasIntElements() == valueType.HasIntElements())
                {
                    // If necessary, instructions before this will bail out on converting a native array
                    changeNativeArray = false;
                }

                if(changeNoMissingValues && checkedSrcValueType.HasNoMissingValues())
                {
                    // If necessary, instructions before this will bail out on creating a missing value
                    changeNoMissingValues = false;
                }

                if((removeHeadSegmentSym || removeHeadSegmentLengthSym || removeLengthSym) && checkedSrc->IsRegOpnd())
                {
                    IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                    if(checkedRegSrc->IsArrayRegOpnd())
                    {
                        IR::ArrayRegOpnd *const checkedArraySrc = checkedSrc->AsRegOpnd()->AsArrayRegOpnd();
                        if(removeHeadSegmentSym && checkedArraySrc->HeadSegmentSym() == arrayOpnd->HeadSegmentSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment sym
                            removeHeadSegmentSym = false;
                        }
                        if(removeHeadSegmentLengthSym &&
                            checkedArraySrc->HeadSegmentLengthSym() == arrayOpnd->HeadSegmentLengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating head segment length sym
                            removeHeadSegmentLengthSym = false;
                        }
                        if(removeLengthSym && checkedArraySrc->LengthSym() == arrayOpnd->LengthSym())
                        {
                            // If necessary, instructions before this will bail out upon invalidating a length sym
                            removeLengthSym = false;
                        }
                    }
                }
            }
        }
        else
        {
            Assert(removeHeadSegmentLengthSym);

            // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web worker,
            // so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there are no forward
            // uses of any head segment length syms, to allow removing the extracted head segment length
            // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
            // removed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                // Implicit calls will be disabled to the point immediately before this instruction
                removeHeadSegmentLengthSym = false;
            }
        }
    }

    if(changeArray || changeNativeArray)
    {
        if(arrayOpnd)
        {
            opnd = arrayOpnd->CopyAsRegOpnd(opndOwnerInstr->m_func);
            if (origOpnd->IsIndirOpnd())
            {
                origOpnd->AsIndirOpnd()->ReplaceBaseOpnd(opnd->AsRegOpnd());
            }
            else
            {
                opndOwnerInstr->Replace(arrayOpnd, opnd);
            }
            arrayOpnd = nullptr;
        }
        opnd->SetValueType(valueType.ToLikely());
    }
    else
    {
        if(changeNoMissingValues)
        {
            opnd->SetValueType(valueType.SetHasNoMissingValues(false));
        }
        if(removeHeadSegmentSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentSym();
        }
        if(removeHeadSegmentLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveHeadSegmentLengthSym();
        }
        if(removeLengthSym)
        {
            Assert(arrayOpnd);
            arrayOpnd->RemoveLengthSym();
        }
    }
}